

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrix.hpp
# Opt level: O3

void deqp::gles2::Functional::MatrixCaseUtils::Evaluator<11,_0,_5,_0,_5>::evaluate
               (ShaderEvalContext *evalCtx)

{
  long lVar1;
  float afStack_3c [9];
  int aiStack_18 [6];
  
  afStack_3c[2] = (float)s_constInMat2 + _DAT_0223f920;
  afStack_3c[3] = (float)DAT_0223f918 + fRam000000000223f928;
  afStack_3c[4] =
       s_constInMat2._4_4_ + fRam000000000223f924 + DAT_0223f918._4_4_ + fRam000000000223f92c;
  aiStack_18[2] = 0;
  aiStack_18[3] = 1;
  aiStack_18[4] = 2;
  lVar1 = 2;
  do {
    (evalCtx->color).m_data[aiStack_18[lVar1]] = afStack_3c[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 5);
  return;
}

Assistant:

Matrix<T, Rows, Cols>& Matrix<T, Rows, Cols>::operator= (const Matrix<T, Rows, Cols>& src)
{
	for (int row = 0; row < Rows; row++)
		for (int col = 0; col < Cols; col++)
			(*this)(row, col) = src(row, col);
	return *this;
}